

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O3

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  _Hash_node_base *AutoPtr;
  InstanceDesc *Desc;
  BottomLevelASVkImpl *pObj;
  Uint32 UVar1;
  TLASBuildInstanceData *Args;
  int iVar2;
  __node_base_ptr p_Var3;
  long lVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  undefined7 uVar6;
  ulong uVar7;
  HIT_GROUP_BINDING_MODE HVar8;
  char cVar9;
  undefined4 in_register_00000084;
  undefined3 in_register_00000089;
  undefined4 uVar10;
  _Hash_node_base *p_Var11;
  bool bVar12;
  Uint32 InstanceOffset;
  string msg;
  Uint32 local_9c;
  undefined8 local_98;
  TLASBuildInstanceData *local_90;
  ulong local_88;
  Uint32 local_80;
  undefined4 local_7c;
  uint local_78;
  Uint32 local_74;
  undefined1 local_70 [32];
  TopLevelASBase<Diligent::EngineVkImplTraits> *local_50;
  long local_48;
  ulong local_40;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  uVar10 = CONCAT31(in_register_00000089,BindingMode);
  local_98 = CONCAT44(in_register_00000084,HitGroupStride);
  if ((this->m_BuildInfo).InstanceCount != InstanceCount) {
    FormatString<char[26],char[49]>
              ((string *)local_70,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_BuildInfo.InstanceCount == InstanceCount",
               (char (*) [49])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex));
    DebugAssertionFailed
              ((Char *)local_70._0_8_,"UpdateInstances",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xac);
    if ((BottomLevelASVkImpl *)local_70._0_8_ != (BottomLevelASVkImpl *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  local_50 = this;
  local_80 = BaseContributionToHitGroupIndex;
  local_9c = BaseContributionToHitGroupIndex;
  if (InstanceCount == 0) {
    cVar9 = '\0';
  }
  else {
    local_38 = &(this->m_Instances)._M_h;
    local_40 = (ulong)InstanceCount;
    local_48 = -local_40;
    uVar7 = 1;
    bVar12 = false;
    local_78 = (uint)BindingMode;
    local_88 = 0;
    local_7c = uVar10;
    do {
      local_90 = pInstances;
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)local_70,pInstances->InstanceName,false);
      p_Var3 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_38,(local_70._8_8_ & 0x7fffffffffffffff) %
                                   (local_50->m_Instances)._M_h._M_bucket_count,
                          (HashMapStringKey *)local_70,local_70._8_8_ & 0x7fffffffffffffff);
      Args = local_90;
      if (p_Var3 == (__node_base_ptr)0x0) {
        p_Var11 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var11 = p_Var3->_M_nxt;
      }
      if (((BottomLevelASVkImpl *)local_70._0_8_ != (BottomLevelASVkImpl *)0x0) &&
         ((long)local_70._8_8_ < 0)) {
        operator_delete__((void *)local_70._0_8_);
      }
      if (p_Var11 == (_Hash_node_base *)0x0) {
        FormatString<char[36],char_const*,char[39]>
                  ((string *)local_70,(Diligent *)"Failed to find instance with name \'",
                   (char (*) [36])Args,(char **)"\' in instances from the previous build",
                   (char (*) [39])CONCAT44(in_register_00000084,HitGroupStride));
        DebugAssertionFailed
                  ((Char *)local_70._0_8_,"UpdateInstances",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                   ,0xb9);
        if ((BottomLevelASVkImpl *)local_70._0_8_ == (BottomLevelASVkImpl *)(local_70 + 0x10)) {
          return bVar12;
        }
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        return bVar12;
      }
      local_74 = *(Uint32 *)&p_Var11[3]._M_nxt;
      AutoPtr = p_Var11 + 4;
      RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)local_70,
                 (RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)AutoPtr);
      pObj = (BottomLevelASVkImpl *)Args->pBLAS;
      if (pObj != (BottomLevelASVkImpl *)0x0) {
        CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                  ((IBottomLevelAS *)pObj);
      }
      Desc = (InstanceDesc *)(p_Var11 + 3);
      RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=
                ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)AutoPtr,pObj);
      Desc->ContributionToHitGroupIndex = local_90->ContributionToHitGroupIndex;
      uVar5 = (ulong)local_78;
      CalculateHitGroupIndex(Desc,&local_9c,(Uint32)local_98,(HIT_GROUP_BINDING_MODE)local_78);
      uVar6 = (undefined7)(uVar5 >> 8);
      if ((local_88 & 1) == 0) {
        local_88 = CONCAT71(uVar6,1);
        if ((BottomLevelASVkImpl *)local_70._0_8_ == (BottomLevelASVkImpl *)AutoPtr->_M_nxt) {
          local_88 = (ulong)CONCAT31((int3)(local_74 >> 8),
                                     local_74 != Desc->ContributionToHitGroupIndex);
        }
      }
      else {
        local_88 = CONCAT71(uVar6,1);
      }
      *(__int_type_conflict1 *)&p_Var11[5]._M_nxt =
           (((BottomLevelASVkImpl *)AutoPtr->_M_nxt)->
           super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_DvpVersion.
           super___atomic_base<unsigned_int>._M_i;
      RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release
                ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)local_70);
      bVar12 = local_40 <= uVar7;
      pInstances = local_90 + 1;
      lVar4 = local_48 + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar4 != 0);
    cVar9 = (char)local_88;
    uVar10 = local_7c;
  }
  UVar1 = (Uint32)local_98;
  HVar8 = (HIT_GROUP_BINDING_MODE)uVar10;
  iVar2 = -1;
  if (HVar8 == HIT_GROUP_BINDING_MODE_PER_TLAS) {
    iVar2 = UVar1 - 1;
  }
  if ((((cVar9 != '\0') || ((local_50->m_BuildInfo).HitGroupStride != UVar1)) ||
      ((local_50->m_BuildInfo).FirstContributionToHitGroupIndex != local_80)) ||
     (((local_50->m_BuildInfo).LastContributionToHitGroupIndex != iVar2 + local_9c ||
      ((local_50->m_BuildInfo).BindingMode != HVar8)))) {
    LOCK();
    (local_50->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
         (local_50->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  (local_50->m_BuildInfo).HitGroupStride = UVar1;
  (local_50->m_BuildInfo).FirstContributionToHitGroupIndex = local_80;
  (local_50->m_BuildInfo).LastContributionToHitGroupIndex = iVar2 + local_9c;
  (local_50->m_BuildInfo).BindingMode = HVar8;
  return true;
}

Assistant:

bool UpdateInstances(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        VERIFY_EXPR(this->m_BuildInfo.InstanceCount == InstanceCount);
#ifdef DILIGENT_DEVELOPMENT
        bool Changed = false;
#endif
        Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

        for (Uint32 i = 0; i < InstanceCount; ++i)
        {
            const auto& Inst = pInstances[i];
            auto        Iter = this->m_Instances.find(Inst.InstanceName);

            if (Iter == this->m_Instances.end())
            {
                UNEXPECTED("Failed to find instance with name '", Inst.InstanceName, "' in instances from the previous build");
                return false;
            }

            auto&      Desc      = Iter->second;
            const auto PrevIndex = Desc.ContributionToHitGroupIndex;
            const auto pPrevBLAS = Desc.pBLAS;

            Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
            Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            //Desc.InstanceIndex             = i; // keep Desc.InstanceIndex unmodified
            CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
            Changed         = Changed || (pPrevBLAS != Desc.pBLAS);
            Changed         = Changed || (PrevIndex != Desc.ContributionToHitGroupIndex);
            Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
        }

        InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

#ifdef DILIGENT_DEVELOPMENT
        Changed = Changed || (this->m_BuildInfo.HitGroupStride != HitGroupStride);
        Changed = Changed || (this->m_BuildInfo.FirstContributionToHitGroupIndex != BaseContributionToHitGroupIndex);
        Changed = Changed || (this->m_BuildInfo.LastContributionToHitGroupIndex != InstanceOffset);
        Changed = Changed || (this->m_BuildInfo.BindingMode != BindingMode);
        if (Changed)
            this->m_DvpVersion.fetch_add(1);
#endif
        this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
        this->m_BuildInfo.BindingMode                      = BindingMode;

        return true;
    }